

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O0

dropt_char * dropt_get_help(dropt_context *context,dropt_help_params *helpParams)

{
  _Bool _Var1;
  int iVar2;
  dropt_stringstream *ss_00;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  dropt_char *newline;
  dropt_char *nextLine;
  char *pcStack_50;
  int lineLen;
  dropt_char *line;
  int m;
  int n;
  _Bool hasShortName;
  uint uStack_38;
  _Bool hasLongName;
  dropt_help_params hp;
  dropt_option *option;
  dropt_stringstream *ss;
  dropt_char *helpText;
  dropt_help_params *helpParams_local;
  dropt_context *context_local;
  
  ss = (dropt_stringstream *)0x0;
  ss_00 = dropt_ssopen();
  if (context == (dropt_context *)0x0) {
    dropt_misuse("No dropt context specified.",
                 "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                 ,0x333);
  }
  else if (ss_00 != (dropt_stringstream *)0x0) {
    if (helpParams == (dropt_help_params *)0x0) {
      dropt_init_help_params((dropt_help_params *)&n);
    }
    else {
      n = helpParams->indent;
      uStack_38 = helpParams->description_start_column;
      hp.indent = *(uint *)&helpParams->blank_lines_between_options;
    }
    hp._4_8_ = context->options;
    while (_Var1 = is_valid_option((dropt_option *)hp._4_8_), _Var1) {
      bVar5 = false;
      if (*(long *)(hp._4_8_ + 8) != 0) {
        bVar5 = **(char **)(hp._4_8_ + 8) != '\0';
      }
      if ((*(long *)(hp._4_8_ + 0x10) != 0) && ((*(uint *)(hp._4_8_ + 0x30) & 2) == 0)) {
        if ((bVar5) && (*(char *)hp._4_8_ != '\0')) {
          line._4_4_ = dropt_ssprintf(ss_00,"%*s-%c, --%s",_n & 0xffffffff,"",
                                      (ulong)(uint)(int)*(char *)hp._4_8_,
                                      *(undefined8 *)(hp._4_8_ + 8));
LAB_001028fa:
          if ((int)line._4_4_ < 0) {
            line._4_4_ = 0;
          }
          if (*(long *)(hp._4_8_ + 0x18) != 0) {
            pcVar4 = "=%s";
            if ((*(uint *)(hp._4_8_ + 0x30) & 4) != 0) {
              pcVar4 = "[=%s]";
            }
            iVar2 = dropt_ssprintf(ss_00,pcVar4,*(undefined8 *)(hp._4_8_ + 0x18));
            if (0 < iVar2) {
              line._4_4_ = iVar2 + line._4_4_;
            }
          }
          if (uStack_38 <= line._4_4_) {
            dropt_ssprintf(ss_00,"\n");
            line._4_4_ = 0;
          }
          pcStack_50 = *(char **)(hp._4_8_ + 0x10);
          while (pcStack_50 != (char *)0x0) {
            pcVar4 = strchr(pcStack_50,10);
            if (pcVar4 == (char *)0x0) {
              sVar3 = strlen(pcStack_50);
              nextLine._4_4_ = (uint)sVar3;
              newline = (dropt_char *)0x0;
            }
            else {
              nextLine._4_4_ = (int)pcVar4 - (int)pcStack_50;
              newline = pcVar4 + 1;
            }
            dropt_ssprintf(ss_00,"%*s%.*s\n",(ulong)(uStack_38 - line._4_4_),"",
                           (ulong)nextLine._4_4_,pcStack_50);
            line._4_4_ = 0;
            pcStack_50 = newline;
          }
        }
        else {
          if (bVar5) {
            line._4_4_ = dropt_ssprintf(ss_00,"%*s--%s",_n & 0xffffffff,"",
                                        *(undefined8 *)(hp._4_8_ + 8));
            goto LAB_001028fa;
          }
          if (*(char *)hp._4_8_ != '\0') {
            line._4_4_ = dropt_ssprintf(ss_00,"%*s-%c",_n & 0xffffffff,"",
                                        (ulong)(uint)(int)*(char *)hp._4_8_);
            goto LAB_001028fa;
          }
          if (*(long *)(hp._4_8_ + 0x10) == 0) {
            __assert_fail("option->description != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                          ,0x367,
                          "dropt_char *dropt_get_help(const dropt_context *, const dropt_help_params *)"
                         );
          }
          dropt_ssprintf(ss_00,"%s\n",*(undefined8 *)(hp._4_8_ + 0x10));
        }
        if ((char)hp.indent != '\0') {
          dropt_ssprintf(ss_00,"\n");
        }
      }
      hp._4_8_ = hp._4_8_ + 0x40;
    }
    ss = (dropt_stringstream *)dropt_ssfinalize(ss_00);
  }
  return (dropt_char *)ss;
}

Assistant:

dropt_char*
dropt_get_help(const dropt_context* context,
               const dropt_help_params* helpParams)
{
    dropt_char* helpText = NULL;
    dropt_stringstream* ss = dropt_ssopen();

    if (context == NULL)
    {
        DROPT_MISUSE("No dropt context specified.");
    }
    else if (ss != NULL)
    {
        const dropt_option* option;
        dropt_help_params hp;

        if (helpParams == NULL)
        {
            dropt_init_help_params(&hp);
        }
        else
        {
            hp = *helpParams;
        }

        for (option = context->options; is_valid_option(option); option++)
        {
            bool hasLongName =    option->long_name != NULL
                               && option->long_name[0] != DROPT_TEXT_LITERAL('\0');
            bool hasShortName = option->short_name != DROPT_TEXT_LITERAL('\0');

            /* The number of characters printed on the current line so far. */
            int n;

            if (   option->description == NULL
                || (option->attr & dropt_attr_hidden))
            {
                /* Undocumented option.  Ignore it and move on. */
                continue;
            }
            else if (hasLongName && hasShortName)
            {
                n = dropt_ssprintf(ss, DROPT_TEXT_LITERAL("%*s-%c, --%s"),
                                   hp.indent, DROPT_TEXT_LITERAL(""),
                                   option->short_name, option->long_name);
            }
            else if (hasLongName)
            {
                n = dropt_ssprintf(ss, DROPT_TEXT_LITERAL("%*s--%s"),
                                   hp.indent, DROPT_TEXT_LITERAL(""),
                                   option->long_name);
            }
            else if (hasShortName)
            {
                n = dropt_ssprintf(ss, DROPT_TEXT_LITERAL("%*s-%c"),
                                   hp.indent, DROPT_TEXT_LITERAL(""),
                                   option->short_name);
            }
            else
            {
                /* Comment text.  Don't bother with indentation. */
                assert(option->description != NULL);
                dropt_ssprintf(ss, DROPT_TEXT_LITERAL("%s\n"), option->description);
                goto next;
            }

            if (n < 0) { n = 0; }

            if (option->arg_description != NULL)
            {
                int m = dropt_ssprintf(ss,
                                       (option->attr & dropt_attr_optional_val)
                                       ? DROPT_TEXT_LITERAL("[=%s]")
                                       : DROPT_TEXT_LITERAL("=%s"),
                                       option->arg_description);
                if (m > 0) { n += m; }
            }

            /* Check for equality to make sure that there's at least one
             * space between the option name and its description.
             */
            if ((unsigned int) n >= hp.description_start_column)
            {
                dropt_ssprintf(ss, DROPT_TEXT_LITERAL("\n"));
                n = 0;
            }

            {
                const dropt_char* line = option->description;
                while (line != NULL)
                {
                    int lineLen;
                    const dropt_char* nextLine;
                    const dropt_char* newline = dropt_strchr(line, DROPT_TEXT_LITERAL('\n'));

                    if (newline == NULL)
                    {
                        lineLen = dropt_strlen(line);
                        nextLine = NULL;
                    }
                    else
                    {
                        lineLen = newline - line;
                        nextLine = newline + 1;
                    }

                    dropt_ssprintf(ss, DROPT_TEXT_LITERAL("%*s%.*s\n"),
                                   hp.description_start_column - n, DROPT_TEXT_LITERAL(""),
                                   lineLen, line);
                    n = 0;

                    line = nextLine;
                }
            }

        next:
            if (hp.blank_lines_between_options)
            {
                dropt_ssprintf(ss, DROPT_TEXT_LITERAL("\n"));
            }
        }
        helpText = dropt_ssfinalize(ss);
    }

    return helpText;
}